

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O2

StatusOr<int>
google::protobuf::json_internal::Proto3Type::EnumNumberByName
          (Field f,string_view name,bool case_insensitive)

{
  void *pvVar1;
  char cVar2;
  void **ppvVar3;
  const_iterator cVar4;
  undefined8 *puVar5;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  char in_R8B;
  RepeatedPtrField<google::protobuf::EnumValue> *this;
  StatusOr<int> SVar6;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  Status _status;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> e;
  Status local_88;
  string local_80;
  undefined1 local_60 [24];
  char *local_48;
  FormatSpec<std::basic_string_view<char>_> local_40;
  
  __y._M_str = (char *)CONCAT71(in_register_00000009,case_insensitive);
  __y._M_len = (Message *)name._M_str;
  local_60._16_8_ = __y._M_len;
  local_48 = __y._M_str;
  ResolverPool::Field::EnumType((Field *)local_60);
  absl::lts_20240722::Status::Status((Status *)&local_80,(Status *)local_60);
  if (local_80._M_dataplus._M_p == (pointer)0x1) {
    absl::lts_20240722::Status::~Status((Status *)&local_80);
    absl::lts_20240722::internal_statusor::
    StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>::EnsureOk
              ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)local_60
              );
    this = &(((Enum *)(local_60._8_8_ + 8))->field_0)._impl_.enumvalue_;
    ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
    cVar4 = RepeatedPtrField<google::protobuf::EnumValue>::end(this);
    for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
      pvVar1 = *ppvVar3;
      puVar5 = (undefined8 *)(*(ulong *)((long)pvVar1 + 0x28) & 0xfffffffffffffffc);
      if (in_R8B == '\0') {
        __x._M_str = (char *)*puVar5;
        __x._M_len = puVar5[1];
        cVar2 = std::operator==(__x,__y);
      }
      else {
        cVar2 = absl::lts_20240722::EqualsIgnoreCase();
      }
      if (cVar2 != '\0') {
        *(undefined4 *)&f->raw_ = *(undefined4 *)((long)pvVar1 + 0x30);
        f->pool_ = (ResolverPool *)0x1;
        goto LAB_00298dbd;
      }
    }
    local_40.super_type.spec_.data_ = "unknown enum value: \'%s\'";
    local_40.super_type.spec_.size_ = 0x18;
    absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
              (&local_80,&local_40,
               (basic_string_view<char,_std::char_traits<char>_> *)(local_60 + 0x10));
    absl::lts_20240722::InvalidArgumentError
              (&local_88,local_80._M_string_length,local_80._M_dataplus._M_p);
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_88);
    absl::lts_20240722::Status::~Status(&local_88);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,(Status *)&local_80);
    absl::lts_20240722::Status::~Status((Status *)&local_80);
  }
LAB_00298dbd:
  absl::lts_20240722::Status::~Status((Status *)local_60);
  SVar6.super_StatusOrData<int>._8_8_ = extraout_RDX;
  SVar6.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar6.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> EnumNumberByName(Field f,
                                                  absl::string_view name,
                                                  bool case_insensitive) {
    auto e = f->EnumType();
    RETURN_IF_ERROR(e.status());

    for (const auto& ev : (**e).proto().enumvalue()) {
      if (case_insensitive) {
        // Two ifs to avoid doing operator== twice if the names are not equal.
        if (absl::EqualsIgnoreCase(ev.name(), name)) {
          return ev.number();
        }
      } else if (ev.name() == name) {
        return ev.number();
      }
    }
    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum value: '%s'", name));
  }